

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O0

UBool icu_63::UCharsTrie::findUniqueValue(UChar *pos,UBool haveUniqueValue,int32_t *uniqueValue)

{
  char cVar1;
  UChar *pUVar2;
  char16_t *pcVar3;
  int local_34;
  int32_t value;
  UBool isFinal;
  int32_t node;
  int32_t *uniqueValue_local;
  char16_t *pcStack_18;
  UBool haveUniqueValue_local;
  UChar *pos_local;
  
  pcStack_18 = pos + 1;
  value = (int32_t)(ushort)*pos;
  uniqueValue_local._7_1_ = haveUniqueValue;
  while( true ) {
    while( true ) {
      while ((uint)value < 0x30) {
        if (value == 0) {
          value = (int32_t)(ushort)*pcStack_18;
          pcStack_18 = pcStack_18 + 1;
        }
        pUVar2 = findUniqueValueFromBranch(pcStack_18,value + 1,uniqueValue_local._7_1_,uniqueValue)
        ;
        if (pUVar2 == (UChar *)0x0) {
          return '\0';
        }
        uniqueValue_local._7_1_ = '\x01';
        pcStack_18 = pUVar2 + 1;
        value = (int32_t)(ushort)*pUVar2;
      }
      if (0x3f < (uint)value) break;
      pcVar3 = pcStack_18 + (value + -0x2f);
      pcStack_18 = pcVar3 + 1;
      value = (int32_t)(ushort)*pcVar3;
    }
    cVar1 = (char)(value >> 0xf);
    if (cVar1 == '\0') {
      local_34 = readNodeValue(pcStack_18,value);
    }
    else {
      local_34 = readValue(pcStack_18,value & 0x7fff);
    }
    if (uniqueValue_local._7_1_ == '\0') {
      *uniqueValue = local_34;
      uniqueValue_local._7_1_ = '\x01';
    }
    else if (local_34 != *uniqueValue) {
      return '\0';
    }
    if (cVar1 != '\0') break;
    pcStack_18 = skipNodeValue(pcStack_18,value);
    value = value & 0x3f;
  }
  return '\x01';
}

Assistant:

UBool
UCharsTrie::findUniqueValue(const UChar *pos, UBool haveUniqueValue, int32_t &uniqueValue) {
    int32_t node=*pos++;
    for(;;) {
        if(node<kMinLinearMatch) {
            if(node==0) {
                node=*pos++;
            }
            pos=findUniqueValueFromBranch(pos, node+1, haveUniqueValue, uniqueValue);
            if(pos==NULL) {
                return FALSE;
            }
            haveUniqueValue=TRUE;
            node=*pos++;
        } else if(node<kMinValueLead) {
            // linear-match node
            pos+=node-kMinLinearMatch+1;  // Ignore the match units.
            node=*pos++;
        } else {
            UBool isFinal=(UBool)(node>>15);
            int32_t value;
            if(isFinal) {
                value=readValue(pos, node&0x7fff);
            } else {
                value=readNodeValue(pos, node);
            }
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return FALSE;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
            if(isFinal) {
                return TRUE;
            }
            pos=skipNodeValue(pos, node);
            node&=kNodeTypeMask;
        }
    }
}